

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O2

Result * CoreML::validateInputOutputTypes
                   (Result *__return_storage_ptr__,
                   RepeatedPtrField<CoreML::Specification::FeatureDescription> *features,
                   ResultReason reason,string *featureTypesDesc)

{
  Rep *pRVar1;
  bool bVar2;
  void **ppvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pRVar1 = (features->super_RepeatedPtrFieldBase).rep_;
  ppvVar3 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar3 = (void **)0x0;
  }
  bVar2 = std::
          all_of<google::protobuf::internal::RepeatedPtrIterator<CoreML::Specification::FeatureDescription_const>,CoreML::validateInputOutputTypes(google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>const&,CoreML::ResultReason,std::__cxx11::string_const&)::_lambda(CoreML::Specification::FeatureDescription_const&)_1_>
                    (ppvVar3,ppvVar3 + (features->super_RepeatedPtrFieldBase).current_size_);
  if (bVar2) {
    Result::Result(__return_storage_ptr__);
  }
  else {
    std::operator+(&local_40,"Neural Networks require ",featureTypesDesc);
    std::operator+(&local_60,&local_40," to be images, MLMultiArray, or State.");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,reason,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateInputOutputTypes(const ::google::protobuf::RepeatedPtrField<Specification::FeatureDescription>& features,
                                       ResultReason reason,
                                       const std::string& featureTypesDesc) {
    auto checkFeatures = [&](const Specification::FeatureDescription& feature) {
        switch (feature.type().Type_case()) {
            case Specification::FeatureType::kImageType:
            case Specification::FeatureType::kMultiArrayType:
            case Specification::FeatureType::kStateType:
                return true;
            default:
                return false;
        }
    };

    if (!std::all_of(features.cbegin(), features.cend(), checkFeatures)) {
         return Result(ResultType::INVALID_MODEL_INTERFACE, reason,
                       "Neural Networks require " + featureTypesDesc + " to be images, MLMultiArray, or State.");
    }

    return Result();
}